

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

StatusOr<google::protobuf::FileDescriptorProto> * __thiscall
google::protobuf::descriptor_unittest::ParameterizeFileProto
          (StatusOr<google::protobuf::FileDescriptorProto> *__return_storage_ptr__,
          descriptor_unittest *this,string_view file_text,ExtensionDeclarationsTestParams *param)

{
  bool bVar1;
  Message *output;
  string_view input;
  string_view message;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  Status local_150 [3];
  descriptor_unittest *local_138;
  size_t sStack_130;
  undefined1 local_120 [8];
  FileDescriptorProto file_proto;
  ExtensionDeclarationsTestParams *param_local;
  string_view file_text_local;
  
  output = (Message *)file_text._M_str;
  file_proto.field_0._224_8_ = output;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_120);
  input._M_str = (char *)local_120;
  input._M_len = file_text._M_len;
  local_138 = this;
  sStack_130 = file_text._M_len;
  bVar1 = TextFormat::ParseFromString((TextFormat *)this,input,output);
  if (bVar1) {
    absl::lts_20250127::StatusOr<google::protobuf::FileDescriptorProto>::
    StatusOr<google::protobuf::FileDescriptorProto,_0>
              (__return_storage_ptr__,(FileDescriptorProto *)local_120);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_160,"Failed to parse the input file text.");
    message._M_str = (char *)local_160._M_len;
    message._M_len = (size_t)local_150;
    absl::lts_20250127::InvalidArgumentError(message);
    absl::lts_20250127::StatusOr<google::protobuf::FileDescriptorProto>::
    StatusOr<absl::lts_20250127::Status,_0>(__return_storage_ptr__,local_150);
    absl::lts_20250127::Status::~Status(local_150);
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_120);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FileDescriptorProto> ParameterizeFileProto(
    absl::string_view file_text, const ExtensionDeclarationsTestParams& param) {
  (void)file_text;  // Parameter is used by Google-internal code.
  (void)param;      // Parameter is used by Google-internal code.
  FileDescriptorProto file_proto;
  if (!TextFormat::ParseFromString(file_text, &file_proto)) {
    return absl::InvalidArgumentError("Failed to parse the input file text.");
  }

  return file_proto;
}